

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void predicate_suite::test_none_of(void)

{
  initializer_list<int> input;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  view_pointer local_a0;
  size_type local_98;
  view_pointer local_90;
  size_type local_88;
  view_pointer local_78;
  size_type local_70;
  view_pointer local_68;
  size_type local_60;
  int local_58 [4];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  local_58[0] = 0xb;
  local_58[1] = 0x16;
  local_58[2] = 0x21;
  local_58[3] = 0x2c;
  local_48 = local_58;
  local_40 = 4;
  input._M_len = 4;
  input._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_68 = iVar2.parent;
  local_60 = iVar2.current;
  local_78 = iVar3.parent;
  local_70 = iVar3.current;
  bVar1 = std::
          none_of<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,predicate_suite::test_none_of()::__0>
                    (local_68,local_60,local_78,local_70);
  boost::detail::test_impl
            ("!std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1bb,"void predicate_suite::test_none_of()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_90 = iVar2.parent;
  local_88 = iVar2.current;
  local_a0 = iVar3.parent;
  local_98 = iVar3.current;
  bVar1 = std::
          none_of<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,predicate_suite::test_none_of()::__1>
                    (local_90,local_88,local_a0,local_98);
  boost::detail::test_impl
            ("std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1bd,"void predicate_suite::test_none_of()",(bool)(-bVar1 & 1));
  return;
}

Assistant:

void test_none_of()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    BOOST_TEST(!std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    BOOST_TEST(std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
}